

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_time(lua_State *L)

{
  int iVar1;
  undefined1 local_50 [8];
  tm ts;
  time_t t;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    ts.tm_zone = (char *)time((time_t *)0x0);
  }
  else {
    luaL_checktype(L,1,5);
    lua_settop(L,1);
    local_50._0_4_ = getfield(L,"sec",0);
    local_50._4_4_ = getfield(L,"min",0);
    ts.tm_sec = getfield(L,"hour",0xc);
    ts.tm_min = getfield(L,"day",-1);
    iVar1 = getfield(L,"month",-1);
    ts.tm_hour = iVar1 + -1;
    iVar1 = getfield(L,"year",-1);
    ts.tm_mday = iVar1 + -0x76c;
    ts.tm_wday = getboolfield(L,"isdst");
    ts.tm_zone = (char *)mktime((tm *)local_50);
  }
  if (ts.tm_zone == (char *)0xffffffffffffffff) {
    lua_pushnil(L);
  }
  else {
    lua_pushnumber(L,(double)(long)ts.tm_zone);
  }
  return 1;
}

Assistant:

LJLIB_CF(os_time)
{
  time_t t;
  if (lua_isnoneornil(L, 1)) {  /* called without args? */
    t = time(NULL);  /* get current time */
  } else {
    struct tm ts;
    luaL_checktype(L, 1, LUA_TTABLE);
    lua_settop(L, 1);  /* make sure table is at the top */
    ts.tm_sec = getfield(L, "sec", 0);
    ts.tm_min = getfield(L, "min", 0);
    ts.tm_hour = getfield(L, "hour", 12);
    ts.tm_mday = getfield(L, "day", -1);
    ts.tm_mon = getfield(L, "month", -1) - 1;
    ts.tm_year = getfield(L, "year", -1) - 1900;
    ts.tm_isdst = getboolfield(L, "isdst");
    t = mktime(&ts);
  }
  if (t == (time_t)(-1))
    lua_pushnil(L);
  else
    lua_pushnumber(L, (lua_Number)t);
  return 1;
}